

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

size_t __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_const_ref t,size_t index,
          size_t prevrank)

{
  subtree_const_ref t_00;
  value_type vVar1;
  leaf_reference this_00;
  size_t sVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_68;
  subtree_ref_base<true> local_58;
  
  if (t._size == index) {
    prevrank = prevrank + t._rank;
  }
  else if (index != 0) {
    if (t._height == 0) {
      this_00 = subtree_ref_base<true>::leaf(&t);
      sVar2 = bitview<bv::internal::bitarray_t<4096UL>::array>::popcount(this_00,0,index);
      prevrank = prevrank + sVar2;
    }
    else {
      pVar3 = subtree_ref_base<true>::find_insert_point(&t,index);
      sVar2 = pVar3.first;
      if (sVar2 != 0) {
        local_68._v = &(t._vector)->ranks;
        local_68._index = (sVar2 - 1) + (t._vector)->degree * t._index;
        vVar1 = const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                ::value(&local_68);
        prevrank = prevrank + vVar1;
      }
      subtree_ref_base<true>::child(&local_58,&t,sVar2);
      t_00._index = local_58._index;
      t_00._vector = local_58._vector;
      t_00._height = local_58._height;
      t_00._size = local_58._size;
      t_00._rank = local_58._rank;
      prevrank = getrank(this,t_00,pVar3.second,prevrank);
    }
  }
  return prevrank;
}

Assistant:

size_t bt_impl<W, AP>::getrank(subtree_const_ref t,
                                       size_t index, size_t prevrank) const
        {
            assert(index <= t.size() && "Index out of bounds");
            
            // Short circuit for special cases
            if(index == t.size())
                return t.rank() + prevrank;
            
            if(index == 0)
                return prevrank;
            
            if(t.is_leaf())
                return t.leaf().popcount(0, index) + prevrank;
            else {
                size_t child, new_index;
                tie(child, new_index) = t.find_insert_point(index);
                
                size_t pr = child == 0 ? prevrank
                                       : prevrank + t.ranks(child - 1);
                
                return getrank(t.child(child), new_index, pr);
            }
        }